

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav_seek_to_pcm_frame(drwav *pWav,drwav_uint64 targetFrameIndex)

{
  drwav_uint64 dVar1;
  drwav_bool32 dVar2;
  drwav_uint32 dVar3;
  ulong uVar4;
  ulong in_RSI;
  drwav *in_RDI;
  int offset32;
  drwav_uint64 offset;
  drwav_uint64 targetBytePos;
  drwav_uint64 currentBytePos;
  drwav_uint64 totalSizeInBytes;
  drwav_uint64 framesToRead;
  drwav_uint64 framesRead;
  drwav_int16 devnull [2048];
  drwav_uint64 offsetInFrames;
  drwav *in_stack_ffffffffffffef78;
  int local_107c;
  ulong local_1058;
  drwav_uint64 local_1038;
  drwav_uint64 local_1030;
  drwav_int16 *in_stack_ffffffffffffefd8;
  drwav_uint64 in_stack_ffffffffffffefe0;
  drwav *in_stack_ffffffffffffefe8;
  drwav_uint64 in_stack_ffffffffffffeff0;
  drwav *in_stack_ffffffffffffeff8;
  ulong local_20;
  ulong local_18;
  drwav_bool32 local_8;
  
  if ((in_RDI == (drwav *)0x0) || (in_RDI->onSeek == (drwav_seek_proc)0x0)) {
    local_8 = 0;
  }
  else if (in_RDI->onWrite == (drwav_write_proc)0x0) {
    if (in_RDI->totalPCMFrameCount == 0) {
      local_8 = 1;
    }
    else {
      local_18 = in_RSI;
      if (in_RDI->totalPCMFrameCount <= in_RSI) {
        local_18 = in_RDI->totalPCMFrameCount - 1;
      }
      if (in_RDI->translatedFormatTag == 2 || in_RDI->translatedFormatTag == 0x11) {
        if ((local_18 < (in_RDI->compressed).iCurrentPCMFrame) &&
           (dVar2 = drwav_seek_to_first_pcm_frame(in_stack_ffffffffffffef78), dVar2 == 0)) {
          return 0;
        }
        if ((in_RDI->compressed).iCurrentPCMFrame < local_18) {
          for (local_20 = local_18 - (in_RDI->compressed).iCurrentPCMFrame; local_20 != 0;
              local_20 = local_20 - local_1030) {
            local_1038 = local_20;
            if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800)) / ZEXT216(in_RDI->channels),0) <
                local_20) {
              local_1038 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800)) / ZEXT216(in_RDI->channels),
                                  0);
            }
            if (in_RDI->translatedFormatTag == 2) {
              local_1030 = drwav_read_pcm_frames_s16__msadpcm
                                     (in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                                      (drwav_int16 *)in_stack_ffffffffffffefe8);
            }
            else {
              if (in_RDI->translatedFormatTag != 0x11) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                              ,0xe8e,"drwav_bool32 drwav_seek_to_pcm_frame(drwav *, drwav_uint64)");
              }
              local_1030 = drwav_read_pcm_frames_s16__ima
                                     (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                                      in_stack_ffffffffffffefd8);
            }
            if (local_1030 != local_1038) {
              return 0;
            }
          }
        }
      }
      else {
        dVar1 = in_RDI->totalPCMFrameCount;
        dVar3 = drwav_get_bytes_per_pcm_frame(in_RDI);
        uVar4 = dVar1 * dVar3;
        if (uVar4 < in_RDI->bytesRemaining) {
          __assert_fail("totalSizeInBytes >= pWav->bytesRemaining",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0xe9f,"drwav_bool32 drwav_seek_to_pcm_frame(drwav *, drwav_uint64)");
        }
        uVar4 = uVar4 - in_RDI->bytesRemaining;
        dVar3 = drwav_get_bytes_per_pcm_frame(in_RDI);
        local_1058 = local_18 * dVar3;
        if (uVar4 < local_1058) {
          local_1058 = local_1058 - uVar4;
        }
        else {
          dVar2 = drwav_seek_to_first_pcm_frame(in_stack_ffffffffffffef78);
          if (dVar2 == 0) {
            return 0;
          }
        }
        for (; local_1058 != 0; local_1058 = local_1058 - (long)local_107c) {
          if (local_1058 < 0x80000000) {
            local_107c = (int)local_1058;
          }
          else {
            local_107c = 0x7fffffff;
          }
          dVar2 = (*in_RDI->onSeek)(in_RDI->pUserData,local_107c,drwav_seek_origin_current);
          if (dVar2 == 0) {
            return 0;
          }
          in_RDI->bytesRemaining = in_RDI->bytesRemaining - (long)local_107c;
        }
      }
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

DRWAV_API drwav_bool32 drwav_seek_to_pcm_frame(drwav* pWav, drwav_uint64 targetFrameIndex)
{
    /* Seeking should be compatible with wave files > 2GB. */

    if (pWav == NULL || pWav->onSeek == NULL) {
        return DRWAV_FALSE;
    }

    /* No seeking in write mode. */
    if (pWav->onWrite != NULL) {
        return DRWAV_FALSE;
    }

    /* If there are no samples, just return DRWAV_TRUE without doing anything. */
    if (pWav->totalPCMFrameCount == 0) {
        return DRWAV_TRUE;
    }

    /* Make sure the sample is clamped. */
    if (targetFrameIndex >= pWav->totalPCMFrameCount) {
        targetFrameIndex  = pWav->totalPCMFrameCount - 1;
    }

    /*
    For compressed formats we just use a slow generic seek. If we are seeking forward we just seek forward. If we are going backwards we need
    to seek back to the start.
    */
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        /* TODO: This can be optimized. */
        
        /*
        If we're seeking forward it's simple - just keep reading samples until we hit the sample we're requesting. If we're seeking backwards,
        we first need to seek back to the start and then just do the same thing as a forward seek.
        */
        if (targetFrameIndex < pWav->compressed.iCurrentPCMFrame) {
            if (!drwav_seek_to_first_pcm_frame(pWav)) {
                return DRWAV_FALSE;
            }
        }

        if (targetFrameIndex > pWav->compressed.iCurrentPCMFrame) {
            drwav_uint64 offsetInFrames = targetFrameIndex - pWav->compressed.iCurrentPCMFrame;

            drwav_int16 devnull[2048];
            while (offsetInFrames > 0) {
                drwav_uint64 framesRead = 0;
                drwav_uint64 framesToRead = offsetInFrames;
                if (framesToRead > drwav_countof(devnull)/pWav->channels) {
                    framesToRead = drwav_countof(devnull)/pWav->channels;
                }

                if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
                    framesRead = drwav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, devnull);
                } else if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
                    framesRead = drwav_read_pcm_frames_s16__ima(pWav, framesToRead, devnull);
                } else {
                    DRWAV_ASSERT(DRWAV_FALSE);  /* If this assertion is triggered it means I've implemented a new compressed format but forgot to add a branch for it here. */
                }

                if (framesRead != framesToRead) {
                    return DRWAV_FALSE;
                }

                offsetInFrames -= framesRead;
            }
        }
    } else {
        drwav_uint64 totalSizeInBytes;
        drwav_uint64 currentBytePos;
        drwav_uint64 targetBytePos;
        drwav_uint64 offset;

        totalSizeInBytes = pWav->totalPCMFrameCount * drwav_get_bytes_per_pcm_frame(pWav);
        DRWAV_ASSERT(totalSizeInBytes >= pWav->bytesRemaining);

        currentBytePos = totalSizeInBytes - pWav->bytesRemaining;
        targetBytePos  = targetFrameIndex * drwav_get_bytes_per_pcm_frame(pWav);

        if (currentBytePos < targetBytePos) {
            /* Offset forwards. */
            offset = (targetBytePos - currentBytePos);
        } else {
            /* Offset backwards. */
            if (!drwav_seek_to_first_pcm_frame(pWav)) {
                return DRWAV_FALSE;
            }
            offset = targetBytePos;
        }

        while (offset > 0) {
            int offset32 = ((offset > INT_MAX) ? INT_MAX : (int)offset);
            if (!pWav->onSeek(pWav->pUserData, offset32, drwav_seek_origin_current)) {
                return DRWAV_FALSE;
            }

            pWav->bytesRemaining -= offset32;
            offset -= offset32;
        }
    }

    return DRWAV_TRUE;
}